

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_1adff5::BumpPointerAllocator::reset(BumpPointerAllocator *this)

{
  BumpPointerAllocator *pBVar1;
  BumpPointerAllocator *__ptr;
  
  pBVar1 = (BumpPointerAllocator *)this->BlockList;
  while (__ptr = pBVar1, __ptr != (BumpPointerAllocator *)0x0) {
    pBVar1 = *(BumpPointerAllocator **)__ptr->InitialBuffer;
    this->BlockList = (BlockMeta *)pBVar1;
    if (__ptr != this) {
      free(__ptr);
      pBVar1 = (BumpPointerAllocator *)this->BlockList;
    }
  }
  this->InitialBuffer[0] = '\0';
  this->InitialBuffer[1] = '\0';
  this->InitialBuffer[2] = '\0';
  this->InitialBuffer[3] = '\0';
  this->InitialBuffer[4] = '\0';
  this->InitialBuffer[5] = '\0';
  this->InitialBuffer[6] = '\0';
  this->InitialBuffer[7] = '\0';
  this->InitialBuffer[8] = '\0';
  this->InitialBuffer[9] = '\0';
  this->InitialBuffer[10] = '\0';
  this->InitialBuffer[0xb] = '\0';
  this->InitialBuffer[0xc] = '\0';
  this->InitialBuffer[0xd] = '\0';
  this->InitialBuffer[0xe] = '\0';
  this->InitialBuffer[0xf] = '\0';
  this->BlockList = (BlockMeta *)this;
  return;
}

Assistant:

void reset() {
    while (BlockList) {
      BlockMeta* Tmp = BlockList;
      BlockList = BlockList->Next;
      if (reinterpret_cast<char*>(Tmp) != InitialBuffer)
        std::free(Tmp);
    }
    BlockList = new (InitialBuffer) BlockMeta{nullptr, 0};
  }